

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O1

void __thiscall
ProblemAloha::splitState(ProblemAloha *this,Index sI,Index *backlog,Index *newPacket)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> splitS;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  IndexTools::JointToIndividualIndicesStepSize(&local_30,sI,this->_m_stepSizeState,2);
  *backlog = *local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  *newPacket = local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[1];
  operator_delete(local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void
ProblemAloha::splitState(Index sI, Index &backlog, Index &newPacket) const
{
    vector<Index> splitS=
        IndexTools::JointToIndividualIndicesStepSize(sI,_m_stepSizeState,2);
    backlog=splitS[0];
    newPacket=splitS[1];
}